

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetTargetObjectNames
          (cmGeneratorTarget *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *objects)

{
  pointer this_00;
  bool bVar1;
  byte bVar2;
  reference ppcVar3;
  pointer ppVar4;
  iterator local_c8;
  _Rb_tree_const_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  const_iterator map_it;
  cmSourceFile *src;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1_1;
  cmSourceFile *sf;
  iterator __end1;
  iterator __begin1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mapping;
  undefined1 local_38 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *objects_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)objects;
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_38);
  GetObjectSources(this,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        local_38,config);
  std::
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&__range1);
  __end1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      local_38);
  sf = (cmSourceFile *)
       std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                 ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                *)&sf);
    if (!bVar1) break;
    ppcVar3 = __gnu_cxx::
              __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              ::operator*(&__end1);
    __range1_1 = (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)*ppcVar3;
    std::
    map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__range1,(key_type *)&__range1_1);
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1);
  }
  (*this->LocalGenerator->_vptr_cmLocalGenerator[0xe])(this->LocalGenerator,&__range1);
  __end1_1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        local_38);
  src = (cmSourceFile *)
        std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                  ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                        *)&src);
    if (!bVar1) {
      std::
      map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__range1);
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_38);
      return;
    }
    ppcVar3 = __gnu_cxx::
              __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              ::operator*(&__end1_1);
    map_it._M_node = (_Base_ptr)*ppcVar3;
    local_c8._M_node =
         (_Base_ptr)
         std::
         map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__range1,(key_type *)&map_it);
    std::
    _Rb_tree_const_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_const_iterator(&local_c0,&local_c8);
    std::
    _Rb_tree_const_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_c0);
    bVar2 = std::__cxx11::string::empty();
    this_00 = objectSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (((bVar2 ^ 0xff) & 1) == 0) break;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,&ppVar4->second);
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1_1);
  }
  __assert_fail("!map_it->second.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                ,0xf70,
                "void cmGeneratorTarget::GetTargetObjectNames(const std::string &, std::vector<std::string> &) const"
               );
}

Assistant:

void cmGeneratorTarget::GetTargetObjectNames(
  std::string const& config, std::vector<std::string>& objects) const
{
  std::vector<cmSourceFile const*> objectSources;
  this->GetObjectSources(objectSources, config);
  std::map<cmSourceFile const*, std::string> mapping;

  for (cmSourceFile const* sf : objectSources) {
    mapping[sf];
  }

  this->LocalGenerator->ComputeObjectFilenames(mapping, this);

  for (cmSourceFile const* src : objectSources) {
    // Find the object file name corresponding to this source file.
    std::map<cmSourceFile const*, std::string>::const_iterator map_it =
      mapping.find(src);
    // It must exist because we populated the mapping just above.
    assert(!map_it->second.empty());
    objects.push_back(map_it->second);
  }
}